

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O0

void __thiscall
crypto_tests::CryptoTest::TestPoly1305
          (CryptoTest *this,string *hexmessage,string *hexkey,string *hextag)

{
  Span<const_std::byte> key_00;
  Span<const_std::byte> msg;
  Span<std::byte> out;
  Span<const_std::byte> key_01;
  Span<const_std::byte> msg_00;
  Span<const_std::byte> msg_01;
  Span<std::byte> out_00;
  Span<const_std::byte> s;
  Span<const_std::byte> s_00;
  string_view hex_str;
  string_view hex_str_00;
  bool bVar1;
  Poly1305 *this_00;
  lazy_ostream *in_RCX;
  long in_RDI;
  long in_FS_OFFSET;
  size_t now;
  int chunk;
  int iter;
  int splits;
  Span<std::byte> data;
  vector<std::byte,_std::allocator<std::byte>_> tagres;
  vector<std::byte,_std::allocator<std::byte>_> m;
  vector<std::byte,_std::allocator<std::byte>_> key;
  Poly1305 poly1305;
  char *in_stack_fffffffffffffc88;
  lazy_ostream *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffc98;
  byte *in_stack_fffffffffffffca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffca8;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffffcb0;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffcb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  int iVar2;
  undefined4 in_stack_fffffffffffffcf8;
  int iVar3;
  undefined4 in_stack_fffffffffffffcfc;
  int iVar4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [103];
  undefined1 local_229;
  Span<std::byte> local_228;
  Span<std::byte> local_218;
  byte *local_1e8;
  size_t local_1e0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [192];
  undefined1 local_f8 [120];
  undefined1 local_80 [120];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffca8);
  hex_str._M_len._4_4_ = in_stack_fffffffffffffcf4;
  hex_str._M_len._0_4_ = in_stack_fffffffffffffcf0;
  hex_str._M_str._0_4_ = in_stack_fffffffffffffcf8;
  hex_str._M_str._4_4_ = in_stack_fffffffffffffcfc;
  ParseHex<std::byte>(hex_str);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffca8);
  hex_str_00._M_len._4_4_ = in_stack_fffffffffffffcf4;
  hex_str_00._M_len._0_4_ = in_stack_fffffffffffffcf0;
  hex_str_00._M_str._0_4_ = in_stack_fffffffffffffcf8;
  hex_str_00._M_str._4_4_ = in_stack_fffffffffffffcfc;
  ParseHex<std::byte>(hex_str_00);
  std::allocator<std::byte>::allocator((allocator<std::byte> *)in_stack_fffffffffffffc88);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (in_stack_fffffffffffffcb8,(size_type)in_stack_fffffffffffffcb0,
             (allocator_type *)in_stack_fffffffffffffca8);
  std::allocator<std::byte>::~allocator((allocator<std::byte> *)in_stack_fffffffffffffc88);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_fffffffffffffc98,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  key_00.m_size = (size_t)in_stack_fffffffffffffca8;
  key_00.m_data = in_stack_fffffffffffffca0;
  Poly1305::Poly1305((Poly1305 *)in_stack_fffffffffffffc98,key_00);
  Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<const_std::byte> *)in_stack_fffffffffffffc98,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  msg.m_size = (size_t)in_stack_fffffffffffffca8;
  msg.m_data = in_stack_fffffffffffffca0;
  this_00 = Poly1305::Update((Poly1305 *)in_stack_fffffffffffffc98,msg);
  Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
            ((Span<std::byte> *)in_stack_fffffffffffffc98,
             (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  out.m_size = (size_t)in_stack_fffffffffffffca8;
  out.m_data = in_stack_fffffffffffffca0;
  Poly1305::Finalize((Poly1305 *)in_stack_fffffffffffffc98,out);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,(const_string *)file,(size_t)in_stack_fffffffffffffcb8,
               (const_string *)in_stack_fffffffffffffcb0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc90,(char (*) [1])in_stack_fffffffffffffc88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
               (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
    Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              ((Span<const_std::byte> *)in_stack_fffffffffffffc98,
               (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc90,
               in_stack_fffffffffffffc88);
    s.m_size = (size_t)in_stack_fffffffffffffcb8;
    s.m_data = (byte *)in_stack_fffffffffffffcb0;
    HexStr_abi_cxx11_(s);
    in_stack_fffffffffffffc98 = "hextag";
    in_stack_fffffffffffffc88 = "HexStr(tagres)";
    in_stack_fffffffffffffc90 = in_RCX;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_1b8,local_1c8,0xeb,1,2,local_80);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc88);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc88);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (iVar4 = 0; iVar4 < 10; iVar4 = iVar4 + 1) {
    for (iVar3 = 0; iVar3 < 10; iVar3 = iVar3 + 1) {
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffffc98,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc90,
                 in_stack_fffffffffffffc88);
      Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<const_std::byte> *)in_stack_fffffffffffffc98,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc90,
                 in_stack_fffffffffffffc88);
      key_01.m_size = (size_t)in_stack_fffffffffffffca8;
      key_01.m_data = in_stack_fffffffffffffca0;
      Poly1305::Poly1305((Poly1305 *)in_stack_fffffffffffffc98,key_01);
      for (iVar2 = 0; iVar2 < iVar4; iVar2 = iVar2 + 1) {
        in_stack_fffffffffffffcb8 =
             (vector<std::byte,_std::allocator<std::byte>_> *)(in_RDI + 0x110);
        Span<std::byte>::size((Span<std::byte> *)in_stack_fffffffffffffc88);
        RandomMixin<FastRandomContext>::randrange<unsigned_long>
                  (in_stack_fffffffffffffcb0,(unsigned_long)in_stack_fffffffffffffca8);
        local_218 = Span<std::byte>::first
                              ((Span<std::byte> *)in_stack_fffffffffffffc98,
                               (size_t)in_stack_fffffffffffffc90);
        Span<const_std::byte>::Span<std::byte,_0>
                  ((Span<const_std::byte> *)in_stack_fffffffffffffc88,(Span<std::byte> *)0x583e9e);
        msg_00.m_size = (size_t)in_stack_fffffffffffffca8;
        msg_00.m_data = in_stack_fffffffffffffca0;
        Poly1305::Update((Poly1305 *)in_stack_fffffffffffffc98,msg_00);
        local_228 = Span<std::byte>::subspan
                              ((Span<std::byte> *)in_stack_fffffffffffffc98,
                               (size_t)in_stack_fffffffffffffc90);
        local_1e8 = local_228.m_data;
        local_1e0 = local_228.m_size;
      }
      local_229 = 0;
      std::vector<std::byte,_std::allocator<std::byte>_>::assign
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc98,
                 (size_type)in_stack_fffffffffffffc90,(value_type *)in_stack_fffffffffffffc88);
      Span<const_std::byte>::Span<std::byte,_0>
                ((Span<const_std::byte> *)in_stack_fffffffffffffc88,(Span<std::byte> *)0x583fec);
      msg_01.m_size = (size_t)in_stack_fffffffffffffca8;
      msg_01.m_data = in_stack_fffffffffffffca0;
      in_stack_fffffffffffffcb0 =
           (RandomMixin<FastRandomContext> *)
           Poly1305::Update((Poly1305 *)in_stack_fffffffffffffc98,msg_01);
      Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                ((Span<std::byte> *)in_stack_fffffffffffffc98,
                 (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc90,
                 in_stack_fffffffffffffc88);
      out_00.m_size = (size_t)in_stack_fffffffffffffca8;
      out_00.m_data = in_stack_fffffffffffffca0;
      Poly1305::Finalize((Poly1305 *)in_stack_fffffffffffffc98,out_00);
      do {
        in_stack_fffffffffffffca8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
                   (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffc88);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)this_00,(const_string *)file,(size_t)in_stack_fffffffffffffcb8
                   ,(const_string *)in_stack_fffffffffffffcb0);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  (in_stack_fffffffffffffc90,(char (*) [1])in_stack_fffffffffffffc88);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffc98,
                   (pointer)in_stack_fffffffffffffc90,(unsigned_long)in_stack_fffffffffffffc88);
        Span<std::byte_const>::Span<std::vector<std::byte,std::allocator<std::byte>>>
                  ((Span<const_std::byte> *)in_stack_fffffffffffffc98,
                   (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc90,
                   in_stack_fffffffffffffc88);
        s_00.m_size = (size_t)in_stack_fffffffffffffcb8;
        s_00.m_data = (byte *)in_stack_fffffffffffffcb0;
        HexStr_abi_cxx11_(s_00);
        in_stack_fffffffffffffc98 = "hextag";
        in_stack_fffffffffffffc88 = "HexStr(tagres)";
        in_stack_fffffffffffffc90 = in_RCX;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                  (local_290,local_2a0,0xf9,1,2,local_f8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc88);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                            *)in_stack_fffffffffffffc88);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc98);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc98);
  std::vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffc98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestPoly1305(const std::string &hexmessage, const std::string &hexkey, const std::string& hextag)
{
    auto key = ParseHex<std::byte>(hexkey);
    auto m = ParseHex<std::byte>(hexmessage);
    std::vector<std::byte> tagres(Poly1305::TAGLEN);
    Poly1305{key}.Update(m).Finalize(tagres);
    BOOST_CHECK_EQUAL(HexStr(tagres), hextag);

    // Test incremental interface
    for (int splits = 0; splits < 10; ++splits) {
        for (int iter = 0; iter < 10; ++iter) {
            auto data = Span{m};
            Poly1305 poly1305{key};
            for (int chunk = 0; chunk < splits; ++chunk) {
                size_t now = m_rng.randrange(data.size() + 1);
                poly1305.Update(data.first(now));
                data = data.subspan(now);
            }
            tagres.assign(Poly1305::TAGLEN, std::byte{});
            poly1305.Update(data).Finalize(tagres);
            BOOST_CHECK_EQUAL(HexStr(tagres), hextag);
        }
    }
}